

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argv_parser.cc
# Opt level: O3

args_t parse(string *s)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  string *psVar5;
  _List_node_base *p_Var6;
  runtime_error *this;
  char **extraout_RDX;
  string *in_RSI;
  ulong uVar7;
  args_t aVar8;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argv;
  string str;
  ostringstream token;
  _List_node_base *local_228;
  _List_node_base *local_220;
  _List_node_base local_218;
  string *local_208;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  string *local_1e8;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  string local_1c8;
  long local_1a8;
  string local_1a0 [104];
  ios_base local_138 [264];
  
  local_200._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_200;
  local_200._M_impl._M_node._M_size = 0;
  local_200._M_impl._M_node.super__List_node_base._M_prev =
       local_200._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  psVar5 = ensure_one_newline(&local_1c8,in_RSI);
  if ((int)(uint)local_1c8._M_string_length < 1) {
LAB_0011d4d8:
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_1e0,
           (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_200);
    args_t::args_t((args_t *)s,
                   (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_1e0);
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_200);
    aVar8.argv = extraout_RDX;
    aVar8._0_8_ = s;
    return aVar8;
  }
  uVar7 = 0;
  local_208 = (string *)0x0;
  bVar3 = false;
  bVar2 = false;
  bVar4 = false;
  local_1e8 = s;
  do {
    bVar1 = local_1c8._M_dataplus._M_p[uVar7];
    psVar5 = (string *)CONCAT71((int7)((ulong)psVar5 >> 8),bVar1);
    if (bVar1 < 0x22) {
      if ((bVar1 - 9 < 2) || (bVar1 == 0x20)) {
        if (bVar4) {
          if (bVar2) {
            local_228 = (_List_node_base *)CONCAT71(local_228._1_7_,bVar1);
            psVar5 = (string *)
                     std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_1a8,(char *)&local_228,1);
          }
          else {
            if (bVar3) {
              local_228 = (_List_node_base *)CONCAT71(local_228._1_7_,bVar1);
              psVar5 = (string *)
                       std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&local_1a8,(char *)&local_228,1);
              goto LAB_0011d2ec;
            }
            std::__cxx11::stringbuf::str();
            p_Var6 = (_List_node_base *)operator_new(0x30);
            p_Var6[1]._M_next = p_Var6 + 2;
            if (local_228 == &local_218) {
              p_Var6[2]._M_next =
                   (_List_node_base *)CONCAT71(local_218._M_next._1_7_,local_218._M_next._0_1_);
              p_Var6[2]._M_prev = local_218._M_prev;
            }
            else {
              p_Var6[1]._M_next = local_228;
              p_Var6[2]._M_next =
                   (_List_node_base *)CONCAT71(local_218._M_next._1_7_,local_218._M_next._0_1_);
            }
            p_Var6[1]._M_prev = local_220;
            local_220 = (_List_node_base *)0x0;
            local_218._M_next._0_1_ = 0;
            local_228 = &local_218;
            std::__detail::_List_node_base::_M_hook(p_Var6);
            local_200._M_impl._M_node._M_size = local_200._M_impl._M_node._M_size + 1;
            if (local_228 != &local_218) {
              operator_delete(local_228);
            }
            local_220 = (_List_node_base *)0x0;
            local_218._M_next._0_1_ = 0;
            local_228 = &local_218;
            std::__cxx11::stringbuf::str(local_1a0);
            if (local_228 != &local_218) {
              operator_delete(local_228);
            }
            bVar4 = false;
            psVar5 = (string *)
                     std::ios::clear((int)*(undefined8 *)(local_1a8 + -0x18) + (int)&local_1a8);
          }
        }
      }
      else {
LAB_0011d23a:
        local_228 = (_List_node_base *)CONCAT71(local_228._1_7_,bVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,(char *)&local_228,1);
        psVar5 = (string *)0x0;
        if (!bVar4) {
          bVar4 = true;
        }
      }
    }
    else if ((bVar1 == 0x22) || (bVar1 == 0x27)) {
      if (bVar3) {
        local_228 = (_List_node_base *)CONCAT71(local_228._1_7_,bVar1);
        psVar5 = (string *)
                 std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,(char *)&local_228,1);
LAB_0011d2ec:
        bVar3 = false;
      }
      else if (bVar4) {
        if (!bVar2) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"Parse Error! Bad quotes");
          goto LAB_0011d5a9;
        }
        if (bVar1 == (byte)local_208) {
          std::__cxx11::stringbuf::str();
          p_Var6 = (_List_node_base *)operator_new(0x30);
          p_Var6[1]._M_next = p_Var6 + 2;
          if (local_228 == &local_218) {
            p_Var6[2]._M_next =
                 (_List_node_base *)CONCAT71(local_218._M_next._1_7_,local_218._M_next._0_1_);
            p_Var6[2]._M_prev = local_218._M_prev;
          }
          else {
            p_Var6[1]._M_next = local_228;
            p_Var6[2]._M_next =
                 (_List_node_base *)CONCAT71(local_218._M_next._1_7_,local_218._M_next._0_1_);
          }
          p_Var6[1]._M_prev = local_220;
          local_220 = (_List_node_base *)0x0;
          local_218._M_next._0_1_ = 0;
          local_228 = &local_218;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          local_200._M_impl._M_node._M_size = local_200._M_impl._M_node._M_size + 1;
          if (local_228 != &local_218) {
            operator_delete(local_228);
          }
          local_220 = (_List_node_base *)0x0;
          local_218._M_next._0_1_ = 0;
          local_228 = &local_218;
          std::__cxx11::stringbuf::str(local_1a0);
          if (local_228 != &local_218) {
            operator_delete(local_228);
          }
          bVar4 = false;
          psVar5 = (string *)
                   std::ios::clear((int)*(undefined8 *)(local_1a8 + -0x18) + (int)&local_1a8);
          bVar2 = false;
        }
        else {
          local_228 = (_List_node_base *)CONCAT71(local_228._1_7_,bVar1);
          psVar5 = (string *)
                   std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1a8,(char *)&local_228,1);
        }
      }
      else {
        bVar4 = true;
        bVar2 = true;
        local_208 = psVar5;
      }
    }
    else {
      if (bVar1 != 0x5c) goto LAB_0011d23a;
      if ((bVar2) && (psVar5 = local_208, local_1c8._M_dataplus._M_p[uVar7 + 1] != (byte)local_208))
      {
        local_228 = (_List_node_base *)CONCAT71(local_228._1_7_,0x5c);
        psVar5 = (string *)
                 std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,(char *)&local_228,1);
      }
      else if (bVar3) {
        local_228 = (_List_node_base *)CONCAT71(local_228._1_7_,0x5c);
        psVar5 = (string *)
                 std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,(char *)&local_228,1);
      }
      else {
        bVar3 = true;
      }
    }
    uVar7 = uVar7 + 1;
  } while (((uint)local_1c8._M_string_length & 0x7fffffff) != uVar7);
  if (bVar2) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Parse Error! Still in container\n");
  }
  else {
    s = local_1e8;
    if (!bVar3) goto LAB_0011d4d8;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Parse Error! Unused escape (\\)\n");
  }
LAB_0011d5a9:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

args_t parse(const string &s) {
    list<string> argv;
    ostringstream token;

    bool in_token;
    bool in_container;
    bool escaped;
    char container_start;
    char c;
    int len;
    int i;

    string str = ensure_one_newline(s);

    container_start = 0;
    in_token = false;
    in_container = false;
    escaped = false;

    len = static_cast<int>(str.length());

    for (i = 0; i < len; i++) {
        c = str[i];

        switch (c) {
            /* handle whitespace */
            case ' ':
            case '\t':
            case '\n':
                if (!in_token)
                    continue;

                if (in_container) {
                    token << c;
                    continue;
                }

                if (escaped) {
                    escaped = false;
                    token << c;
                    continue;
                }

                /* if reached here, we're at end of token */
                in_token = false;
                argv.push_back(token.str());
                token.str(string());
                token.clear();
                break;

                /* handle quotes */
            case '\'':
            case '\"':

                if (escaped) {
                    token << c;
                    escaped = false;
                    continue;
                }

                if (!in_token) {
                    in_token = true;
                    in_container = true;
                    container_start = c;
                    continue;
                }

                if (in_container) {
                    if (c == container_start) {
                        in_container = false;
                        in_token = false;
                        argv.push_back(token.str());
                        token.str(string());
                        token.clear();
                        continue;
                    } else {
                        token << c;
                        continue;
                    }
                }

                /* XXX in this case, we:
                 *    1. have a quote
                 *    2. are in a token
                 *    3. and not in a container
                 * e.g.
                 *    hell"o
                 *
                 * what'str done here appears shell-dependent,
                 * but overall, it'str an error.... i *think*
                 */
                throw runtime_error("Parse Error! Bad quotes");
            case '\\':

                if (in_container && str[i + 1] != container_start) {
                    token << c;
                    continue;
                }

                if (escaped) {
                    token << c;
                    continue;
                }

                escaped = true;
                break;

            default:
                if (!in_token) {
                    in_token = true;
                }

                token << c;
        }
    }

    if (in_container)
        throw runtime_error("Parse Error! Still in container\n");

    if (escaped)
        throw runtime_error("Parse Error! Unused escape (\\)\n");

    return args_t(argv);
}